

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void avx::ProjectionProfile
               (uint32_t rowSize,uint8_t *imageStart,uint32_t height,bool horizontal,uint32_t *out,
               uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined7 in_register_00000009;
  uint8_t *puVar2;
  uint32_t uVar3;
  long lVar4;
  int iVar5;
  uint8_t *puVar6;
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [32];
  undefined1 auVar15 [32];
  undefined1 auVar11 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  
  if ((int)CONCAT71(in_register_00000009,horizontal) == 0) {
    if (height * rowSize != 0) {
      puVar2 = imageStart + height * rowSize;
      puVar6 = imageStart + totalSimdWidth;
      do {
        auVar11 = ZEXT1664((undefined1  [16])0x0);
        auVar13 = auVar11._0_32_;
        if (simdWidth != 0) {
          lVar4 = 0;
          do {
            auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar15 = vpunpcklbw_avx2(*(undefined1 (*) [32])(imageStart + lVar4),auVar9);
            auVar13 = vpunpckhbw_avx2(*(undefined1 (*) [32])(imageStart + lVar4),auVar9);
            auVar13 = vpaddw_avx2(auVar15,auVar13);
            auVar15 = vpunpcklwd_avx2(auVar13,auVar9);
            auVar13 = vpunpckhwd_avx2(auVar13,auVar9);
            auVar13 = vpaddd_avx2(auVar11._0_32_,auVar13);
            auVar13 = vpaddd_avx2(auVar13,auVar15);
            auVar11 = ZEXT3264(auVar13);
            lVar4 = lVar4 + 0x20;
          } while ((ulong)simdWidth << 5 != lVar4);
        }
        if (nonSimdWidth != 0) {
          uVar3 = *out;
          uVar7 = 0;
          do {
            uVar3 = uVar3 + puVar6[uVar7];
            *out = uVar3;
            uVar7 = uVar7 + 1;
          } while (nonSimdWidth != uVar7);
        }
        auVar1 = vphaddd_avx(auVar13._16_16_,auVar13._0_16_);
        auVar1 = vphaddd_avx(auVar1,auVar1);
        auVar1 = vphaddd_avx(auVar1,auVar1);
        *out = *out + auVar1._0_4_;
        imageStart = imageStart + rowSize;
        out = out + 1;
        puVar6 = puVar6 + rowSize;
      } while (imageStart != puVar2);
    }
  }
  else {
    if (totalSimdWidth != 0) {
      puVar2 = imageStart + totalSimdWidth;
      do {
        auVar11 = ZEXT1664((undefined1  [16])0x0);
        auVar10 = auVar11._0_32_;
        auVar12 = ZEXT1664((undefined1  [16])0x0);
        auVar9 = auVar12._0_32_;
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        auVar15 = auVar16._0_32_;
        auVar14 = ZEXT1664((undefined1  [16])0x0);
        auVar13 = auVar14._0_32_;
        if ((ulong)(height * rowSize) != 0) {
          uVar7 = 0;
          do {
            auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar15 = vpunpcklbw_avx2(*(undefined1 (*) [32])(imageStart + uVar7),auVar8);
            auVar10 = vpunpckhbw_avx2(*(undefined1 (*) [32])(imageStart + uVar7),auVar8);
            auVar13 = vpunpcklwd_avx2(auVar15,auVar8);
            auVar13 = vpaddd_avx2(auVar14._0_32_,auVar13);
            auVar14 = ZEXT3264(auVar13);
            auVar15 = vpunpckhwd_avx2(auVar15,auVar8);
            auVar15 = vpaddd_avx2(auVar16._0_32_,auVar15);
            auVar16 = ZEXT3264(auVar15);
            auVar9 = vpunpcklwd_avx2(auVar10,auVar8);
            auVar9 = vpaddd_avx2(auVar12._0_32_,auVar9);
            auVar12 = ZEXT3264(auVar9);
            auVar10 = vpunpckhwd_avx2(auVar10,auVar8);
            auVar10 = vpaddd_avx2(auVar11._0_32_,auVar10);
            auVar11 = ZEXT3264(auVar10);
            uVar7 = uVar7 + rowSize;
          } while (height * rowSize != uVar7);
        }
        auVar13 = vpaddd_avx2(auVar13,*(undefined1 (*) [32])out);
        *(undefined1 (*) [32])out = auVar13;
        auVar13 = vpaddd_avx2(auVar15,*(undefined1 (*) [32])((long)out + 0x20));
        *(undefined1 (*) [32])((long)out + 0x20) = auVar13;
        auVar13 = vpaddd_avx2(auVar9,*(undefined1 (*) [32])((long)out + 0x40));
        *(undefined1 (*) [32])((long)out + 0x40) = auVar13;
        auVar13 = vpaddd_avx2(auVar10,*(undefined1 (*) [32])((long)out + 0x60));
        *(undefined1 (*) [32])((long)out + 0x60) = auVar13;
        imageStart = imageStart + 0x20;
        out = (uint32_t *)((long)out + 0x80);
      } while (imageStart != puVar2);
    }
    if (nonSimdWidth != 0) {
      puVar2 = imageStart + nonSimdWidth;
      do {
        if ((ulong)(height * rowSize) != 0) {
          iVar5 = *(int *)*(undefined1 (*) [32])out;
          uVar7 = 0;
          do {
            iVar5 = iVar5 + (uint)imageStart[uVar7];
            *(int *)*(undefined1 (*) [32])out = iVar5;
            uVar7 = uVar7 + rowSize;
          } while (height * rowSize != uVar7);
        }
        imageStart = imageStart + 1;
        out = (uint32_t *)(*(undefined1 (*) [32])out + 4);
      } while (imageStart != puVar2);
    }
  }
  return;
}

Assistant:

void ProjectionProfile( uint32_t rowSize, const uint8_t * imageStart, uint32_t height, bool horizontal,
                            uint32_t * out, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd zero = _mm256_setzero_si256();

        if( horizontal ) {
            const uint8_t * imageSimdXEnd = imageStart + totalSimdWidth;

            for( ; imageStart != imageSimdXEnd; imageStart += simdSize, out += simdSize ) {
                const uint8_t * imageSimdY = imageStart;
                const uint8_t * imageSimdYEnd = imageSimdY + height * rowSize;
                simd simdSum_1 = _mm256_setzero_si256();
                simd simdSum_2 = _mm256_setzero_si256();
                simd simdSum_3 = _mm256_setzero_si256();
                simd simdSum_4 = _mm256_setzero_si256();

                simd * dst = reinterpret_cast <simd*> (out);

                for( ; imageSimdY != imageSimdYEnd; imageSimdY += rowSize) {
                    const simd * src    = reinterpret_cast <const simd*> (imageSimdY);

                    const simd data = _mm256_loadu_si256( src );

                    const simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                    const simd dataHi  = _mm256_unpackhi_epi8( data, zero );

                    const simd data_1 = _mm256_unpacklo_epi16( dataLo, zero );
                    const simd data_2 = _mm256_unpackhi_epi16( dataLo, zero );
                    const simd data_3 = _mm256_unpacklo_epi16( dataHi, zero );
                    const simd data_4 = _mm256_unpackhi_epi16( dataHi, zero );
                    simdSum_1 = _mm256_add_epi32( data_1, simdSum_1 );
                    simdSum_2 = _mm256_add_epi32( data_2, simdSum_2 );
                    simdSum_3 = _mm256_add_epi32( data_3, simdSum_3 );
                    simdSum_4 = _mm256_add_epi32( data_4, simdSum_4 );
                }

                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_1, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_2, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_3, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_4, _mm256_loadu_si256( dst ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t* imageXEnd = imageStart + nonSimdWidth;

                for( ; imageStart != imageXEnd; ++imageStart, ++out ) {
                    const uint8_t * imageY    = imageStart;
                    const uint8_t * imageYEnd = imageY + height * rowSize;

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*out) += (*imageY);
                }
            }
        }
        else {
            const uint8_t * imageYEnd = imageStart + height * rowSize;

            for( ; imageStart != imageYEnd; imageStart += rowSize, ++out ) {
                const simd * src    = reinterpret_cast <const simd*> (imageStart);
                const simd * srcEnd = src + simdWidth;
                simd simdSum = _mm256_setzero_si256();

                for( ; src != srcEnd; ++src ) {
                    simd data = _mm256_loadu_si256( src );

                    simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                    simd dataHi  = _mm256_unpackhi_epi8( data, zero );
                    simd sumLoHi = _mm256_add_epi16( dataLo, dataHi );

                    simdSum = _mm256_add_epi32( simdSum, _mm256_add_epi32( _mm256_unpacklo_epi16( sumLoHi, zero ),
                                                                           _mm256_unpackhi_epi16( sumLoHi, zero ) ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * imageX    = imageStart + totalSimdWidth;
                    const uint8_t * imageXEnd = imageX + nonSimdWidth;

                    for( ; imageX != imageXEnd; ++imageX )
                        (*out) += (*imageX);
                }

                uint32_t output[8] = { 0 };
                _mm256_storeu_si256( reinterpret_cast <simd*>(output), simdSum );
                
                (*out) += output[0] + output[1] + output[2] + output[3] + output[4] + output[5] + output[6] + output[7];
            }
        }
    }